

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

int Js::AssertIntegerProperty(DynamicObject *state,PropertyIds propertyId)

{
  code *pcVar1;
  bool bVar2;
  _E propertyId_00;
  ScriptContext *requestContext;
  undefined4 *puVar3;
  double value;
  int32 local_24;
  Var pvStack_20;
  int ret;
  Var propertyValue;
  DynamicObject *state_local;
  PropertyIds propertyId_local;
  
  pvStack_20 = (Var)0x0;
  propertyValue = state;
  state_local._0_4_ = propertyId._value;
  propertyId_00 = PropertyIds::operator_cast_to__E((PropertyIds *)&state_local);
  requestContext = RecyclableObject::GetScriptContext((RecyclableObject *)propertyValue);
  JavascriptOperators::GetProperty
            (&state->super_RecyclableObject,propertyId_00,&stack0xffffffffffffffe0,requestContext,
             (PropertyValueInfo *)0x0);
  if (pvStack_20 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x183,"(propertyValue)","propertyValue");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TaggedInt::Is(pvStack_20);
  if (bVar2) {
    state_local._4_4_ = TaggedInt::ToInt32(pvStack_20);
  }
  else {
    bVar2 = JavascriptNumber::Is(pvStack_20);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x18b,"(JavascriptNumber::Is(propertyValue))",
                                  "JavascriptNumber::Is(propertyValue)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    value = JavascriptNumber::GetValue(pvStack_20);
    bVar2 = JavascriptNumber::TryGetInt32Value<false>(value,&local_24);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x18d,
                                  "(JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret))"
                                  ,
                                  "JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    state_local._4_4_ = local_24;
  }
  return state_local._4_4_;
}

Assistant:

static int AssertIntegerProperty(_In_ DynamicObject *state, _In_ PropertyIds propertyId)
    {
        Var propertyValue = nullptr;
        JavascriptOperators::GetProperty(state, propertyId, &propertyValue, state->GetScriptContext());

        AssertOrFailFast(propertyValue);

        if (TaggedInt::Is(propertyValue))
        {
            return TaggedInt::ToInt32(propertyValue);
        }
        else
        {
            AssertOrFailFast(JavascriptNumber::Is(propertyValue));
            int ret;
            AssertOrFailFast(JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret));

            return ret;
        }
    }